

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

void __thiscall TRM::ActiveEdgeList::rewind(ActiveEdgeList *this,FILE *__stream)

{
  Edge **ppEVar1;
  float fVar2;
  float fVar3;
  Edge *pEVar4;
  Vertex *pVVar5;
  Vertex *pVVar6;
  Vertex *in_RDX;
  Edge *pEVar7;
  Edge *pEVar8;
  Edge **ppEVar9;
  
  if ((__stream != (FILE *)0x0) && (pVVar6 = *(Vertex **)__stream, pVVar6 != in_RDX)) {
    fVar2 = (pVVar6->point).field_1.y;
    fVar3 = (in_RDX->point).field_1.y;
    if ((fVar3 <= fVar2) &&
       (((fVar2 != fVar3 || (NAN(fVar2) || NAN(fVar3))) ||
        (fVar2 = (in_RDX->point).field_0.x,
        fVar2 < (pVVar6->point).field_0.x || fVar2 == (pVVar6->point).field_0.x)))) {
      if (pVVar6 != in_RDX) {
        ppEVar1 = &(this->super_LinkedList<TRM::Edge>).tail;
        do {
          pVVar6 = pVVar6->prev;
          for (pEVar7 = (pVVar6->edge_below).head; pEVar7 != (Edge *)0x0;
              pEVar7 = pEVar7->below_next) {
            ppEVar9 = &pEVar7->left->right;
            if (pEVar7->left == (Edge *)0x0) {
              ppEVar9 = (Edge **)this;
            }
            *ppEVar9 = pEVar7->right;
            ppEVar9 = &pEVar7->right->left;
            if (pEVar7->right == (Edge *)0x0) {
              ppEVar9 = ppEVar1;
            }
            *ppEVar9 = pEVar7->left;
            pEVar7->left = (Edge *)0x0;
            pEVar7->right = (Edge *)0x0;
          }
          pEVar7 = (pVVar6->edge_above).head;
          if (pEVar7 != (Edge *)0x0) {
            pEVar8 = pVVar6->left;
            do {
              ppEVar9 = &pEVar8->right;
              if (pEVar8 == (Edge *)0x0) {
                ppEVar9 = (Edge **)this;
              }
              pEVar4 = *ppEVar9;
              pEVar7->left = pEVar8;
              pEVar7->right = pEVar4;
              *ppEVar9 = pEVar7;
              ppEVar9 = &pEVar4->left;
              if (pEVar4 == (Edge *)0x0) {
                ppEVar9 = ppEVar1;
              }
              *ppEVar9 = pEVar7;
              pVVar5 = pEVar7->top;
              fVar2 = (pVVar5->point).field_1.y;
              fVar3 = (in_RDX->point).field_1.y;
              if (((fVar2 < fVar3) ||
                  (((fVar2 == fVar3 && (!NAN(fVar2) && !NAN(fVar3))) &&
                   (fVar3 = (in_RDX->point).field_0.x,
                   (pVVar5->point).field_0.x <= fVar3 && fVar3 != (pVVar5->point).field_0.x)))) &&
                 (((pEVar8 = pVVar5->left, pEVar8 != (Edge *)0x0 &&
                   ((double)(pVVar5->point).field_0.x * pEVar8->le_a + (double)fVar2 * pEVar8->le_b
                    + pEVar8->le_c <= 0.0)) ||
                  ((pEVar8 = pVVar5->right, pEVar8 != (Edge *)0x0 &&
                   (0.0 <= (double)(pVVar5->point).field_0.x * pEVar8->le_a +
                           (double)fVar2 * pEVar8->le_b + pEVar8->le_c)))))) {
                in_RDX = pVVar5;
              }
              ppEVar9 = &pEVar7->above_next;
              pEVar8 = pEVar7;
              pEVar7 = *ppEVar9;
            } while (*ppEVar9 != (Edge *)0x0);
          }
        } while (pVVar6 != in_RDX);
      }
      *(Vertex **)__stream = pVVar6;
    }
  }
  return;
}

Assistant:

void ActiveEdgeList::rewind(Vertex** current, Vertex* dst) {
  if (!current || *current == dst ||
      VertexCompare::Compare((*current)->point, dst->point)) {
    return;
  }

  Vertex* v = *current;

  while (v != dst) {
    v = v->prev;

    for (auto e = v->edge_below.head; e; e = e->below_next) {
      this->remove(e);
    }

    auto left = v->left;

    for (auto e = v->edge_above.head; e; e = e->above_next) {
      this->insert(e, left);
      left = e;

      auto top = e->top;
      if (VertexCompare::Compare(top->point, dst->point) &&
          ((top->left && !top->left->is_left_of(e->top->point)) ||
           (top->right && !top->right->is_right_of(e->top->point)))) {
        dst = top;
      }
    }
  }

  *current = v;
}